

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void FreeMp3(drmp3 *mp3)

{
  SDL_RWops *ctx;
  SDL_RWops *rw;
  drmp3 *mp3_local;
  
  ctx = (SDL_RWops *)mp3->pUserData;
  if (ctx != (SDL_RWops *)0x0) {
    drmp3_uninit(mp3);
    mp3->pUserData = (void *)0x0;
    SDL20_RWclose(ctx);
  }
  return;
}

Assistant:

static void
FreeMp3(drmp3 *mp3)
{
    SDL_RWops *rw = (SDL_RWops *) mp3->pUserData;
    if (rw) {
        drmp3_uninit(mp3);
        mp3->pUserData = NULL;
        SDL20_RWclose(rw);
    }
}